

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QKeyCombination>::assign<QKeyCombination_const*,q20::identity>
          (QArrayDataPointer<QKeyCombination> *this,int *first,int *last)

{
  Data *pDVar1;
  QKeyCombination *pQVar2;
  qsizetype qVar3;
  QKeyCombination *pQVar4;
  QKeyCombination *pQVar5;
  QKeyCombination *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QKeyCombination>_*,_QKeyCombination_*> pVar9;
  QArrayDataPointer<QKeyCombination> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (long)last - (long)first >> 2;
  pDVar1 = this->d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc < lVar7)) {
    qVar3 = detachCapacity(this,lVar7);
    pVar9 = QTypedArrayData<QKeyCombination>::allocate(qVar3,KeepSize);
    local_38.d = this->d;
    local_38.ptr = this->ptr;
    this->d = pVar9.first;
    this->ptr = pVar9.second;
    local_38.size = this->size;
    this->size = 0;
    ~QArrayDataPointer(&local_38);
  }
  qVar3 = freeSpaceAtBegin(this);
  pQVar2 = this->ptr;
  lVar7 = this->size;
  pQVar6 = pQVar2 + -qVar3;
  pQVar4 = pQVar2;
  pQVar5 = pQVar6;
  if (qVar3 != 0) {
    this->ptr = pQVar6;
    for (lVar8 = qVar3 * -4; pQVar4 = pQVar6, pQVar5 = pQVar2, lVar8 != 0; lVar8 = lVar8 + 4) {
      if (first == last) {
        pQVar5 = (QKeyCombination *)((long)&pQVar2->combination + lVar8);
        goto LAB_003e299c;
      }
      *(int *)((long)&pQVar2->combination + lVar8) = *first;
      first = first + 1;
    }
  }
  for (; first != last; first = first + 1) {
    pQVar6 = pQVar2 + lVar7;
    if (pQVar5 == pQVar2 + lVar7) goto LAB_003e298c;
    pQVar5->combination = *first;
    pQVar5 = pQVar5 + 1;
  }
LAB_003e299c:
  this->size = (long)pQVar5 - (long)pQVar4 >> 2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
LAB_003e298c:
  for (; pQVar5 = pQVar6, first != last; first = first + 1) {
    pQVar5->combination = *first;
    pQVar6 = pQVar5 + 1;
  }
  goto LAB_003e299c;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }